

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

ZoneHashNode * __thiscall asmjit::ZoneHashBase::_put(ZoneHashBase *this,ZoneHashNode *node)

{
  long lVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint uVar4;
  ZoneHashNode *in_RSI;
  long in_RDI;
  uint32_t newCapacity;
  ZoneHashNode *next;
  uint32_t hMod;
  
  uVar4 = *(uint *)(in_RSI + 8) % *(uint *)(in_RDI + 0x10);
  lVar1 = *(long *)(*(long *)(in_RDI + 0x18) + (ulong)uVar4 * 8);
  *(long *)in_RSI = lVar1;
  *(ZoneHashNode **)(*(long *)(in_RDI + 0x18) + (ulong)uVar4 * 8) = in_RSI;
  uVar3 = *(long *)(in_RDI + 8) + 1;
  *(ulong *)(in_RDI + 8) = uVar3;
  if (((*(uint *)(in_RDI + 0x14) <= uVar3) && (lVar1 != 0)) &&
     (uVar2 = ZoneHash_getClosestPrime(*(uint32_t *)(in_RDI + 0x10)),
     uVar2 != *(uint32_t *)(in_RDI + 0x10))) {
    _rehash((ZoneHashBase *)next,newCapacity);
  }
  return in_RSI;
}

Assistant:

ZoneHashNode* ZoneHashBase::_put(ZoneHashNode* node) noexcept {
  uint32_t hMod = node->_hVal % _bucketsCount;
  ZoneHashNode* next = _data[hMod];

  node->_hashNext = next;
  _data[hMod] = node;

  if (++_size >= _bucketsGrow && next) {
    uint32_t newCapacity = ZoneHash_getClosestPrime(_bucketsCount);
    if (newCapacity != _bucketsCount)
      _rehash(newCapacity);
  }

  return node;
}